

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_set_non_blocking_mode(sock_t sock)

{
  uint uVar1;
  int flags;
  sock_t sock_local;
  
  uVar1 = fcntl64(sock,3,0);
  fcntl64(sock,4,uVar1 | 0x800);
  return;
}

Assistant:

void mg_set_non_blocking_mode(sock_t sock) {
#ifdef _WIN32
                                                                                                                            unsigned long on = 1;
  ioctlsocket(sock, FIONBIO, &on);
#elif defined(MG_CC3200)
    cc3200_set_non_blocking_mode(sock);
#else
    int flags = fcntl(sock, F_GETFL, 0);
    fcntl(sock, F_SETFL, flags | O_NONBLOCK);
#endif
}